

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorProto::FileDescriptorProto(FileDescriptorProto *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileDescriptorProto_0028faa0;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  (this->dependency_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->service_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->service_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  (this->public_dependency_).elements_ = (int *)0x0;
  (this->public_dependency_).current_size_ = 0;
  (this->public_dependency_).total_size_ = 0;
  (this->weak_dependency_).elements_ = (int *)0x0;
  (this->weak_dependency_).current_size_ = 0;
  (this->weak_dependency_).total_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.elements_ = (void **)0x0;
  (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_ = 0;
  (this->message_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->package_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->options_ = (FileOptions *)0x0;
  this->source_code_info_ = (SourceCodeInfo *)0x0;
  return;
}

Assistant:

FileDescriptorProto::FileDescriptorProto()
  : ::google::protobuf::Message() {
  SharedCtor();
}